

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void UA_MoniteredItem_SampleCallback(UA_Server *server,UA_MonitoredItem *monitoredItem)

{
  UA_Subscription *pUVar1;
  UA_Byte *pUVar2;
  UA_Session *pUVar3;
  UA_SecureChannel *pUVar4;
  MonitoredItem_queuedValue *pMVar5;
  MonitoredItem_queuedValue **ppMVar6;
  byte bVar7;
  MonitoredItem_queuedValue *pMVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 auVar11 [8];
  UA_StatusCode UVar12;
  int iVar13;
  size_t __size;
  MonitoredItem_queuedValue *__ptr;
  MonitoredItem_queuedValue *pMVar14;
  byte bVar15;
  ulong uVar16;
  long lVar17;
  UA_DataValue *pUVar18;
  UA_DataValue *pUVar19;
  ulong uVar20;
  byte bVar21;
  undefined1 auStack_368 [504];
  undefined8 uStack_170;
  UA_ReadValueId local_168;
  UA_DataValue local_118;
  size_t sStack_b0;
  UA_ByteString cbs;
  undefined1 auStack_48 [8];
  UA_ByteString valueEncoding;
  
  bVar21 = 0;
  if (monitoredItem->monitoredItemType != UA_MONITOREDITEMTYPE_CHANGENOTIFY) {
    return;
  }
  pUVar1 = monitoredItem->subscription;
  local_168.dataEncoding.name.length = 0;
  local_168.dataEncoding.name.data = (UA_Byte *)0x0;
  local_168.dataEncoding.namespaceIndex = 0;
  local_168.dataEncoding._2_6_ = 0;
  local_168.nodeId.namespaceIndex = (monitoredItem->monitoredNodeId).namespaceIndex;
  local_168.nodeId._2_2_ = *(undefined2 *)&(monitoredItem->monitoredNodeId).field_0x2;
  local_168.nodeId.identifierType = (monitoredItem->monitoredNodeId).identifierType;
  local_168.nodeId.identifier.string.length =
       (monitoredItem->monitoredNodeId).identifier.string.length;
  local_168.nodeId.identifier.string.data = (monitoredItem->monitoredNodeId).identifier.string.data;
  local_168._28_4_ = 0;
  local_168.attributeId = monitoredItem->attributeID;
  local_168.indexRange.length = (monitoredItem->indexRange).length;
  local_168.indexRange.data = (monitoredItem->indexRange).data;
  local_118.serverTimestamp = 0;
  local_118.serverPicoseconds = 0;
  local_118._90_6_ = 0;
  local_118.sourceTimestamp = 0;
  local_118.sourcePicoseconds = 0;
  local_118._74_6_ = 0;
  local_118.value.arrayDimensions = (UA_UInt32 *)0x0;
  local_118.status = 0;
  local_118._60_4_ = 0;
  local_118.value.data = (void *)0x0;
  local_118.value.arrayDimensionsSize = 0;
  local_118.value.storageType = UA_VARIANT_DATA;
  local_118.value._12_4_ = 0;
  local_118.value.arrayLength = 0;
  local_118._0_8_ = 0;
  local_118.value.type = (UA_DataType *)0x0;
  uStack_170 = 0x124204;
  valueEncoding.data = (UA_Byte *)server;
  Service_Read_single(server,(UA_Session *)monitoredItem,monitoredItem->timestampsToReturn,
                      &local_168,&local_118);
  auStack_48 = (undefined1  [8])0x200;
  uVar9 = local_118._0_1_;
  if (monitoredItem->trigger == UA_DATACHANGETRIGGER_STATUS) {
    local_118._0_8_ = local_118._0_8_ & 0xfffffffffffffffe;
  }
  uVar10 = local_118._0_1_;
  bVar15 = 0xd7;
  if (monitoredItem->trigger < UA_DATACHANGETRIGGER_STATUSVALUETIMESTAMP) {
    bVar15 = 0xc3;
  }
  local_118._0_1_ = bVar15 & local_118._0_1_;
  valueEncoding.length = (size_t)auStack_368;
  __size = UA_calcSizeBinary(&local_118,UA_TYPES + 0x16);
  if (__size == 0) {
LAB_0012431a:
    bVar7 = 0;
    bVar15 = 0;
  }
  else {
    auVar11 = auStack_48;
    if (0x200 < __size) {
      auStack_48 = (undefined1  [8])0x0;
      valueEncoding.length = 0;
      valueEncoding.length = (size_t)malloc(__size);
      auVar11 = (undefined1  [8])__size;
      if ((void *)valueEncoding.length == (void *)0x0) goto LAB_0012431a;
    }
    auStack_48 = auVar11;
    encodeBuf = (UA_ByteString *)auStack_48;
    pos = (UA_Byte *)valueEncoding.length;
    end = (UA_Byte *)(valueEncoding.length + (long)auStack_48);
    bVar7 = 0;
    exchangeBufferCallback = (UA_exchangeEncodeBuffer)0x0;
    exchangeBufferCallbackHandle = (void *)0x0;
    UVar12 = UA_encodeBinaryInternal(&local_118,UA_TYPES + 0x16);
    bVar15 = 0;
    if (UVar12 == 0) {
      auStack_48 = (undefined1  [8])((long)pos - valueEncoding.length);
      pUVar2 = (monitoredItem->lastSampledValue).data;
      if (((pUVar2 == (UA_Byte *)0x0) ||
          (auStack_48 != (undefined1  [8])(monitoredItem->lastSampledValue).length)) ||
         (iVar13 = bcmp((void *)valueEncoding.length,pUVar2,(size_t)auStack_48), iVar13 != 0)) {
        bVar7 = 1;
        bVar15 = 1;
      }
      else {
        bVar15 = 1;
        bVar7 = 0;
      }
    }
  }
  local_118._0_1_ = uVar10 & 0x3c | uVar9 & 1 | local_118._0_1_ & 0xc2;
  if ((bool)(bVar7 & bVar15)) {
    __ptr = (MonitoredItem_queuedValue *)malloc(0x78);
    if (__ptr != (MonitoredItem_queuedValue *)0x0) {
      if ((undefined1 *)valueEncoding.length == auStack_368) {
        UVar12 = UA_copy(auStack_48,&sStack_b0,UA_TYPES + 0xe);
        if (UVar12 == 0) {
          auStack_48 = (undefined1  [8])sStack_b0;
          valueEncoding.length = cbs.length;
        }
        else {
          pUVar3 = pUVar1->session;
          pUVar4 = pUVar3->channel;
          uVar20 = 0;
          uVar16 = 0;
          if ((pUVar4 != (UA_SecureChannel *)0x0) && (pUVar4->connection != (UA_Connection *)0x0)) {
            uVar16 = (ulong)(uint)pUVar4->connection->sockfd;
          }
          if (pUVar4 != (UA_SecureChannel *)0x0) {
            uVar20 = (ulong)(pUVar4->securityToken).channelId;
          }
          cbs.data = (UA_Byte *)(ulong)(pUVar3->sessionId).identifier.guid.data4[3];
          UA_LOG_WARNING(*(UA_Logger *)(valueEncoding.data + 0x80),UA_LOGCATEGORY_SESSION,
                         "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | MonitoredItem %i | ByteString to compare values could not be created"
                         ,uVar16,uVar20,(ulong)(pUVar3->sessionId).identifier.numeric,
                         (ulong)(pUVar3->sessionId).identifier.guid.data2,
                         (ulong)(pUVar3->sessionId).identifier.guid.data3,
                         (ulong)(pUVar3->sessionId).identifier.guid.data4[0],
                         (ulong)(pUVar3->sessionId).identifier.guid.data4[1],
                         (ulong)(pUVar3->sessionId).identifier.guid.data4[2],cbs.data,
                         (ulong)(pUVar3->sessionId).identifier.guid.data4[4],
                         (ulong)(pUVar3->sessionId).identifier.guid.data4[5],
                         (ulong)(pUVar3->sessionId).identifier.guid.data4[6],
                         (ulong)(pUVar3->sessionId).identifier.guid.data4[7],
                         (ulong)pUVar1->subscriptionID,(ulong)monitoredItem->itemId);
          free(__ptr);
        }
        if (UVar12 != 0) goto LAB_0012472e;
      }
      if (((local_118._0_8_ & 1) == 0) || (local_118.value.storageType != UA_VARIANT_DATA_NODELETE))
      {
        pUVar18 = &local_118;
        pUVar19 = &__ptr->value;
        for (lVar17 = 0xc; lVar17 != 0; lVar17 = lVar17 + -1) {
          *(undefined8 *)pUVar19 = *(undefined8 *)pUVar18;
          pUVar18 = (UA_DataValue *)((long)pUVar18 + ((ulong)bVar21 * -2 + 1) * 8);
          pUVar19 = (UA_DataValue *)((long)pUVar19 + (ulong)bVar21 * -0x10 + 8);
        }
      }
      else {
        UVar12 = UA_copy(&local_118,&__ptr->value,UA_TYPES + 0x16);
        if (UVar12 != 0) {
          pUVar3 = pUVar1->session;
          pUVar4 = pUVar3->channel;
          uVar20 = 0;
          uVar16 = 0;
          if ((pUVar4 != (UA_SecureChannel *)0x0) && (pUVar4->connection != (UA_Connection *)0x0)) {
            uVar16 = (ulong)(uint)pUVar4->connection->sockfd;
          }
          pUVar2 = valueEncoding.data + 0x80;
          if (pUVar4 != (UA_SecureChannel *)0x0) {
            uVar20 = (ulong)(pUVar4->securityToken).channelId;
          }
          valueEncoding.data = (UA_Byte *)(ulong)(pUVar3->sessionId).identifier.guid.data2;
          UA_LOG_WARNING(*(UA_Logger *)pUVar2,UA_LOGCATEGORY_SESSION,
                         "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | MonitoredItem %i | Item for the publishing queue could not be prepared"
                         ,uVar16,uVar20,(ulong)(pUVar3->sessionId).identifier.numeric,
                         valueEncoding.data,(ulong)(pUVar3->sessionId).identifier.guid.data3,
                         (ulong)(pUVar3->sessionId).identifier.guid.data4[0],
                         (ulong)(pUVar3->sessionId).identifier.guid.data4[1],
                         (ulong)(pUVar3->sessionId).identifier.guid.data4[2],
                         (ulong)(pUVar3->sessionId).identifier.guid.data4[3],
                         (ulong)(pUVar3->sessionId).identifier.guid.data4[4],
                         (ulong)(pUVar3->sessionId).identifier.guid.data4[5],
                         (ulong)(pUVar3->sessionId).identifier.guid.data4[6],
                         (ulong)(pUVar3->sessionId).identifier.guid.data4[7],
                         (ulong)pUVar1->subscriptionID,(ulong)monitoredItem->itemId);
          free(__ptr);
          goto LAB_0012472e;
        }
      }
      __ptr->clientHandle = monitoredItem->clientHandle;
      deleteMembers_noInit(&monitoredItem->lastSampledValue,UA_TYPES + 0xe);
      (monitoredItem->lastSampledValue).length = (size_t)auStack_48;
      (monitoredItem->lastSampledValue).data = (UA_Byte *)valueEncoding.length;
      if (monitoredItem->maxQueueSize <= monitoredItem->currentQueueSize) {
        if (monitoredItem->discardOldest == true) {
          pMVar14 = (MonitoredItem_queuedValue *)&monitoredItem->queue;
        }
        else {
          pMVar14 = (monitoredItem->queue).tqh_last[1];
        }
        pMVar14 = (pMVar14->listEntry).tqe_next;
        if (pMVar14 == (MonitoredItem_queuedValue *)0x0) {
          __assert_fail("queueItem",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jh-isw[P]OpcUaConsoleClient/open62541/open62541.c"
                        ,0x5cc2,"void ensureSpaceInMonitoredItemQueue(UA_MonitoredItem *)");
        }
        pMVar5 = (pMVar14->listEntry).tqe_next;
        pMVar8 = pMVar5;
        if (pMVar5 == (MonitoredItem_queuedValue *)0x0) {
          pMVar8 = (MonitoredItem_queuedValue *)&monitoredItem->queue;
        }
        (pMVar8->listEntry).tqe_prev = (pMVar14->listEntry).tqe_prev;
        *(pMVar14->listEntry).tqe_prev = pMVar5;
        deleteMembers_noInit(&pMVar14->value,UA_TYPES + 0x16);
        (pMVar14->value).serverTimestamp = 0;
        *(undefined8 *)&(pMVar14->value).serverPicoseconds = 0;
        (pMVar14->value).sourceTimestamp = 0;
        *(undefined8 *)&(pMVar14->value).sourcePicoseconds = 0;
        (pMVar14->value).value.arrayDimensions = (UA_UInt32 *)0x0;
        *(undefined8 *)&(pMVar14->value).status = 0;
        (pMVar14->value).value.data = (void *)0x0;
        (pMVar14->value).value.arrayDimensionsSize = 0;
        *(undefined8 *)&(pMVar14->value).value.storageType = 0;
        (pMVar14->value).value.arrayLength = 0;
        *(undefined8 *)&pMVar14->value = 0;
        (pMVar14->value).value.type = (UA_DataType *)0x0;
        free(pMVar14);
        monitoredItem->currentQueueSize = monitoredItem->currentQueueSize - 1;
      }
      (__ptr->listEntry).tqe_next = (MonitoredItem_queuedValue *)0x0;
      ppMVar6 = (monitoredItem->queue).tqh_last;
      (__ptr->listEntry).tqe_prev = ppMVar6;
      *ppMVar6 = __ptr;
      (monitoredItem->queue).tqh_last = (MonitoredItem_queuedValue **)__ptr;
      monitoredItem->currentQueueSize = monitoredItem->currentQueueSize + 1;
      return;
    }
    pUVar3 = pUVar1->session;
    pUVar4 = pUVar3->channel;
    uVar20 = 0;
    uVar16 = 0;
    if ((pUVar4 != (UA_SecureChannel *)0x0) && (pUVar4->connection != (UA_Connection *)0x0)) {
      uVar16 = (ulong)(uint)pUVar4->connection->sockfd;
    }
    pUVar2 = valueEncoding.data + 0x80;
    if (pUVar4 != (UA_SecureChannel *)0x0) {
      uVar20 = (ulong)(pUVar4->securityToken).channelId;
    }
    valueEncoding.data = (UA_Byte *)(ulong)(pUVar3->sessionId).identifier.guid.data2;
    UA_LOG_WARNING(*(UA_Logger *)pUVar2,UA_LOGCATEGORY_SESSION,
                   "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | Subscription %u | MonitoredItem %i | Item for the publishing queue could not be allocated"
                   ,uVar16,uVar20,(ulong)(pUVar3->sessionId).identifier.numeric,valueEncoding.data,
                   (ulong)(pUVar3->sessionId).identifier.guid.data3,
                   (ulong)(pUVar3->sessionId).identifier.guid.data4[0],
                   (ulong)(pUVar3->sessionId).identifier.guid.data4[1],
                   (ulong)(pUVar3->sessionId).identifier.guid.data4[2],
                   (ulong)(pUVar3->sessionId).identifier.guid.data4[3],
                   (ulong)(pUVar3->sessionId).identifier.guid.data4[4],
                   (ulong)(pUVar3->sessionId).identifier.guid.data4[5],
                   (ulong)(pUVar3->sessionId).identifier.guid.data4[6],
                   (ulong)(pUVar3->sessionId).identifier.guid.data4[7],(ulong)pUVar1->subscriptionID
                   ,(ulong)monitoredItem->itemId);
  }
LAB_0012472e:
  if ((undefined1 *)valueEncoding.length != auStack_368) {
    deleteMembers_noInit(auStack_48,UA_TYPES + 0xe);
    auStack_48 = (undefined1  [8])0x0;
    valueEncoding.length = 0;
  }
  deleteMembers_noInit(&local_118,UA_TYPES + 0x16);
  return;
}

Assistant:

void UA_MoniteredItem_SampleCallback(UA_Server *server, UA_MonitoredItem *monitoredItem) {
    UA_Subscription *sub = monitoredItem->subscription;
    if(monitoredItem->monitoredItemType != UA_MONITOREDITEMTYPE_CHANGENOTIFY) {
        UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                             "Subscription %u | MonitoredItem %i | "
                             "Not a data change notification",
                             sub->subscriptionID, monitoredItem->itemId);
        return;
    }

    /* Read the value */
    UA_ReadValueId rvid;
    UA_ReadValueId_init(&rvid);
    rvid.nodeId = monitoredItem->monitoredNodeId;
    rvid.attributeId = monitoredItem->attributeID;
    rvid.indexRange = monitoredItem->indexRange;
    UA_DataValue value;
    UA_DataValue_init(&value);
    Service_Read_single(server, sub->session, monitoredItem->timestampsToReturn,
                        &rvid, &value);

    /* Stack-allocate some memory for the value encoding */
    UA_Byte *stackValueEncoding = UA_alloca(UA_VALUENCODING_MAXSTACK);
    UA_ByteString valueEncoding;
    valueEncoding.data = stackValueEncoding;
    valueEncoding.length = UA_VALUENCODING_MAXSTACK;

    /* Has the value changed? */
    UA_Boolean changed = false;
    UA_StatusCode retval = detectValueChange(monitoredItem, &value,
                                             &valueEncoding, &changed);
    if(!changed || retval != UA_STATUSCODE_GOOD)
        goto cleanup;

    /* Allocate the entry for the publish queue */
    MonitoredItem_queuedValue *newQueueItem = UA_malloc(sizeof(MonitoredItem_queuedValue));
    if(!newQueueItem) {
        UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                               "Subscription %u | MonitoredItem %i | "
                               "Item for the publishing queue could not be allocated",
                               sub->subscriptionID, monitoredItem->itemId);
        goto cleanup;
    }

    /* Copy valueEncoding on the heap for the next comparison (if not already done) */
    if(valueEncoding.data == stackValueEncoding) {
        UA_ByteString cbs;
        if(UA_ByteString_copy(&valueEncoding, &cbs) != UA_STATUSCODE_GOOD) {
            UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                                   "Subscription %u | MonitoredItem %i | "
                                   "ByteString to compare values could not be created",
                                   sub->subscriptionID, monitoredItem->itemId);
            UA_free(newQueueItem);
            goto cleanup;
        }
        valueEncoding = cbs;
    }

    /* Prepare the newQueueItem */
    if(value.hasValue && value.value.storageType == UA_VARIANT_DATA_NODELETE) {
        if(UA_DataValue_copy(&value, &newQueueItem->value) != UA_STATUSCODE_GOOD) {
            UA_LOG_WARNING_SESSION(server->config.logger, sub->session,
                                   "Subscription %u | MonitoredItem %i | "
                                   "Item for the publishing queue could not be prepared",
                                   sub->subscriptionID, monitoredItem->itemId);
            UA_free(newQueueItem);
            goto cleanup;
        }
    } else {
        newQueueItem->value = value;
    }
    newQueueItem->clientHandle = monitoredItem->clientHandle;

    /* <-- Point of no return --> */

    UA_LOG_DEBUG_SESSION(server->config.logger, sub->session,
                         "Subscription %u | MonitoredItem %u | Sampled a new value",
                         sub->subscriptionID, monitoredItem->itemId);

    /* Replace the encoding for comparison */
    UA_ByteString_deleteMembers(&monitoredItem->lastSampledValue);
    monitoredItem->lastSampledValue = valueEncoding;

    /* Add the sample to the queue for publication */
    ensureSpaceInMonitoredItemQueue(monitoredItem);
    TAILQ_INSERT_TAIL(&monitoredItem->queue, newQueueItem, listEntry);
    ++monitoredItem->currentQueueSize;
    return;

 cleanup:
    if(valueEncoding.data != stackValueEncoding)
        UA_ByteString_deleteMembers(&valueEncoding);
    UA_DataValue_deleteMembers(&value);
}